

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProceduralBlockVisitor.hpp
# Opt level: O0

void __thiscall
netlist::ProceduralBlockVisitor::connectDeclToVar
          (ProceduralBlockVisitor *this,NetlistVariableReference *varNode,Symbol *symbol)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Symbol *in_stack_00000060;
  NetlistVariableDeclaration *declNode;
  NetlistNode *in_stack_ffffffffffffff78;
  Netlist *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  
  resolveSymbolHierPath_abi_cxx11_(in_stack_00000060);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  Netlist::lookupVariable(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(in_RDI);
  DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>::addEdge
            ((DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge> *)in_RDI,
             in_stack_ffffffffffffff78,(NetlistNode *)0x1dac1e);
  return;
}

Assistant:

void connectDeclToVar(NetlistVariableReference& varNode, ast::Symbol const& symbol) {
        auto* declNode = netlist.lookupVariable(resolveSymbolHierPath(symbol));
        netlist.addEdge(*declNode, varNode);
        DEBUG_PRINT("New edge: declaration {} -> reference {}\n", declNode->hierarchicalPath,
                    varNode.getName());
    }